

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_1_comp_init(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = G->val[-1];
  (G->data).root = pPVar1;
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_comp_init(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define e G->val[-1]
  yyprintf((stderr, "do yy_1_comp_init"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
    yy = (G->data.root = e);\n\
}\n"));
  
    yy = (G->data.root = e);
;
#undef e
}